

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.cpp
# Opt level: O0

void __thiscall particle::collideWith(particle *this,particle *other)

{
  long in_RSI;
  vec2<float> *in_RDI;
  vec2f change;
  floatingType changeSpeed;
  vec2f direction;
  vec2<float> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  floatingType in_stack_ffffffffffffffcc;
  vec2<float> local_2c;
  floatingType local_24;
  vec2<float> local_20;
  vec2<float> local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_20 = vec2<float>::operator-(in_stack_ffffffffffffffb8,(vec2<float> *)0x124bd2);
  local_18 = vec2<float>::getNormalized
                       ((vec2<float> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       );
  local_2c = vec2<float>::operator-(in_stack_ffffffffffffffb8,(vec2<float> *)0x124bff);
  local_24 = vec2<float>::operator*(&local_2c,&local_18);
  if (local_24 < 0.0) {
    ::operator*((float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
    vec2<float>::operator-=(in_RDI + 1,(vec2<float> *)&stack0xffffffffffffffcc);
    vec2<float>::operator+=((vec2<float> *)(local_10 + 8),(vec2<float> *)&stack0xffffffffffffffcc);
  }
  return;
}

Assistant:

void particle::collideWith(particle& other)
{
    vec2f direction = (position - other.position).getNormalized();
    vec2f::floatingType changeSpeed = (velocity - other.velocity) * direction;
    if(changeSpeed < 0)
    {
        vec2f change = changeSpeed * direction;
        velocity -= change;
        other.velocity += change;
    }
}